

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

pool_ptr<soul::heart::ProcessorInstance> __thiscall
soul::ModuleCloner::getRemappedProcessorInstance
          (ModuleCloner *this,pool_ptr<soul::heart::ProcessorInstance> *old)

{
  mapped_type *pmVar1;
  Module *pMVar2;
  pool_ptr<soul::heart::ProcessorInstance> *in_RDX;
  key_type local_18;
  
  if (in_RDX->object == (ProcessorInstance *)0x0) {
    pMVar2 = (Module *)0x0;
  }
  else {
    local_18.object = pool_ptr<soul::heart::ProcessorInstance>::operator*(in_RDX);
    pmVar1 = std::__detail::
             _Map_base<soul::pool_ref<const_soul::heart::ProcessorInstance>,_std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::ProcessorInstance>,_std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(old + 0x1a),&local_18);
    pMVar2 = (Module *)pmVar1->object;
  }
  this->oldModule = pMVar2;
  return (pool_ptr<soul::heart::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

pool_ptr<heart::ProcessorInstance> getRemappedProcessorInstance (pool_ptr<heart::ProcessorInstance> old)
    {
        if (old == nullptr)
            return {};

        return processorInstanceMappings[*old];
    }